

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int enable_domain_check(TLS_IO_INSTANCE *tlsInstance)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  X509_VERIFY_PARAM *param;
  int result;
  TLS_IO_INSTANCE *tlsInstance_local;
  
  if ((tlsInstance->ignore_host_name_check & 1U) == 0) {
    uVar3 = SSL_get0_param(tlsInstance->ssl);
    X509_VERIFY_PARAM_set_hostflags(uVar3,0);
    iVar2 = X509_VERIFY_PARAM_set1_ip_asc(uVar3,tlsInstance->hostname);
    if (iVar2 == 0) {
      pcVar1 = tlsInstance->hostname;
      sVar4 = strlen(tlsInstance->hostname);
      iVar2 = X509_VERIFY_PARAM_set1_host(uVar3,pcVar1,sVar4);
      if (iVar2 == 0) {
        return 0x418;
      }
    }
    SSL_set_verify((SSL *)tlsInstance->ssl,1,(callback *)0x0);
  }
  return 0;
}

Assistant:

static int enable_domain_check(TLS_IO_INSTANCE* tlsInstance)
{
    int result = 0;

    if (!tlsInstance->ignore_host_name_check)
    {
#if (OPENSSL_VERSION_NUMBER < 0x10002000L)
#error "OpenSSL v1.0.2 or above required. See https://wiki.openssl.org/index.php/Hostname_validation for details."
#endif
        X509_VERIFY_PARAM *param = SSL_get0_param(tlsInstance->ssl);

        X509_VERIFY_PARAM_set_hostflags(param, 0);
        if (!(X509_VERIFY_PARAM_set1_ip_asc(param, tlsInstance->hostname) ||
              X509_VERIFY_PARAM_set1_host(param, tlsInstance->hostname, strlen(tlsInstance->hostname))))
        {
            result = MU_FAILURE;
        }
        else
        {
            SSL_set_verify(tlsInstance->ssl, SSL_VERIFY_PEER, NULL);
        }
    }

    return result;
}